

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_interval_heap.cpp
# Opt level: O0

void __thiscall interval_heap_sorting::test_method(interval_heap_sorting *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  lazy_ostream *prev;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_118;
  int *local_f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  undefined1 local_db;
  bool local_da;
  value_expr<bool> local_d9;
  assertion_result local_d8;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  int *local_98;
  int *local_90;
  int *local_80;
  int *local_78;
  int *local_68;
  int *local_60;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> original;
  value_type_conflict2 local_2c;
  undefined1 local_28 [4];
  int i;
  vector<int,_std::allocator<int>_> heap_arr;
  interval_heap_sorting *this_local;
  
  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  for (local_2c = 0; local_2c < 0x41b; local_2c = local_2c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_28,&local_2c);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,
             (vector<int,_std::allocator<int>_> *)local_28);
  local_60 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_28);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_28);
  boost::heap::
  make_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_60,local_68);
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_28);
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_28);
  boost::heap::
  sort_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_78,local_80);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_58);
  local_98 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_58);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_90,local_98);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_interval_heap.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_b0,0x4f,&local_c0);
    local_e8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_28);
    local_f0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_28);
    local_f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)local_58);
    local_db = std::
               equal<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (local_e8,local_f0,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          local_f8);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_d9,&local_da);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_d8,&local_d9,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,"std::equal(heap_arr.begin(), heap_arr.end(), original.begin())",0x3e);
    boost::unit_test::operator<<(&local_118,prev,&local_128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_interval_heap.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,&local_118.super_lazy_ostream,&local_138,0x4f,REQUIRE,CHECK_BUILT_ASSERTION
               ,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_118);
    boost::test_tools::assertion_result::~assertion_result(&local_d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( interval_heap_sorting )
{
  using namespace boost::heap;
  std::vector<int> heap_arr;
  for (int i = 0; i < 1051; ++i)
    heap_arr.push_back(i);
  std::vector<int> original = heap_arr;
  make_interval_heap(heap_arr.begin(), heap_arr.end(), std::less<int>());

  sort_interval_heap(heap_arr.begin(), heap_arr.end(), std::less<int>());
  std::sort(original.begin(), original.end(), std::less<int>());
  BOOST_TEST_REQUIRE(std::equal(heap_arr.begin(), heap_arr.end(), original.begin()));
}